

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.cpp
# Opt level: O1

Result __thiscall
Controller::generateBoard(Controller *this,BoardSize boardSize,BoardMode boardMode)

{
  ImageProvider *this_00;
  _Head_base<0UL,_Board_*,_false> __ptr;
  bool bVar1;
  _Head_base<0UL,_Board_*,_false> this_01;
  
  if (boardMode == GRAPHIC) {
    this_00 = (this->imageProvider)._M_t.
              super___uniq_ptr_impl<ImageProvider,_std::default_delete<ImageProvider>_>._M_t.
              super__Tuple_impl<0UL,_ImageProvider_*,_std::default_delete<ImageProvider>_>.
              super__Head_base<0UL,_ImageProvider_*,_false>._M_head_impl;
    if (this_00 == (ImageProvider *)0x0) {
      return CREATE_GRAPHIC_BOARD_NO_GRAPHIC;
    }
    bVar1 = ImageProvider::isGraphicBoard(this_00,boardSize);
    if (!bVar1) {
      return CREATE_GRAPHIC_BOARD_NO_GRAPHIC;
    }
  }
  this_01._M_head_impl = (Board *)operator_new(0x38);
  Board::Board(this_01._M_head_impl,boardSize,boardMode);
  __ptr._M_head_impl =
       (this->board)._M_t.super___uniq_ptr_impl<Board,_std::default_delete<Board>_>._M_t.
       super__Tuple_impl<0UL,_Board_*,_std::default_delete<Board>_>.
       super__Head_base<0UL,_Board_*,_false>._M_head_impl;
  (this->board)._M_t.super___uniq_ptr_impl<Board,_std::default_delete<Board>_>._M_t.
  super__Tuple_impl<0UL,_Board_*,_std::default_delete<Board>_>.super__Head_base<0UL,_Board_*,_false>
  ._M_head_impl = this_01._M_head_impl;
  if (__ptr._M_head_impl != (Board *)0x0) {
    std::default_delete<Board>::operator()((default_delete<Board> *)this,__ptr._M_head_impl);
  }
  Board::generateBoard
            ((this->board)._M_t.super___uniq_ptr_impl<Board,_std::default_delete<Board>_>._M_t.
             super__Tuple_impl<0UL,_Board_*,_std::default_delete<Board>_>.
             super__Head_base<0UL,_Board_*,_false>._M_head_impl);
  UndoMove::Reset((this->undoMoveService)._M_t.
                  super___uniq_ptr_impl<UndoMove,_std::default_delete<UndoMove>_>._M_t.
                  super__Tuple_impl<0UL,_UndoMove_*,_std::default_delete<UndoMove>_>.
                  super__Head_base<0UL,_UndoMove_*,_false>._M_head_impl);
  return OK;
}

Assistant:

Result Controller::generateBoard( BoardSize boardSize, BoardMode boardMode )
{
    if ( boardMode == BoardMode::GRAPHIC && ( isGraphic( boardSize ) == false ))
    {
        return Result::CREATE_GRAPHIC_BOARD_NO_GRAPHIC;
    }
    board.reset( new Board( boardSize, boardMode ));
    board->generateBoard();
    undoMoveService->Reset();
    return Result::OK;
}